

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  unspecified_bool_type p_Var1;
  xpath_node *in_RDX;
  xpath_node *in_RSI;
  bool bVar2;
  xml_attribute a;
  xml_node rn;
  xml_node ln;
  void *ro;
  void *lo;
  xpath_node *in_stack_ffffffffffffff28;
  xml_node in_stack_ffffffffffffff40;
  xml_node in_stack_ffffffffffffff48;
  xml_attribute local_b0;
  xml_node_struct *local_a8;
  xml_node local_a0;
  xml_node local_98;
  xml_attribute local_90;
  xml_node_struct *local_88;
  xml_node_struct *local_80;
  xml_attribute_struct *local_78;
  xml_attribute local_70;
  xml_attribute local_68;
  xml_node local_60;
  xml_node local_58;
  xml_attribute local_50;
  xml_attribute local_48;
  xml_node local_40;
  xml_node local_38;
  void *local_30;
  void *local_28;
  xpath_node *local_20;
  xpath_node *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = document_buffer_order((xpath_node *)in_stack_ffffffffffffff48._root);
  local_30 = document_buffer_order((xpath_node *)in_stack_ffffffffffffff48._root);
  if ((local_28 == (void *)0x0) || (local_30 == (void *)0x0)) {
    local_38 = xpath_node::node(in_stack_ffffffffffffff28);
    local_40 = xpath_node::node(in_stack_ffffffffffffff28);
    local_48 = xpath_node::attribute(local_18);
    p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_48);
    bVar2 = false;
    if (p_Var1 != (unspecified_bool_type)0x0) {
      local_50 = xpath_node::attribute(local_20);
      p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_50);
      bVar2 = p_Var1 != (unspecified_bool_type)0x0;
    }
    if (bVar2) {
      local_58 = xpath_node::parent(in_stack_ffffffffffffff28);
      local_60 = xpath_node::parent(in_stack_ffffffffffffff28);
      bVar2 = xml_node::operator==(&local_58,&local_60);
      if (bVar2) {
        local_68 = xpath_node::attribute(local_18);
        while( true ) {
          p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_68);
          if (p_Var1 == (unspecified_bool_type)0x0) {
            return false;
          }
          local_70 = xpath_node::attribute(local_20);
          bVar2 = xml_attribute::operator==(&local_68,&local_70);
          if (bVar2) break;
          local_78 = (xml_attribute_struct *)
                     xml_attribute::next_attribute((xml_attribute *)in_stack_ffffffffffffff28);
          local_68 = (xml_attribute)local_78;
        }
        return true;
      }
      local_80 = (xml_node_struct *)xpath_node::parent(in_stack_ffffffffffffff28);
      local_38 = (xml_node)local_80;
      local_88 = (xml_node_struct *)xpath_node::parent(in_stack_ffffffffffffff28);
      local_40 = (xml_node)local_88;
    }
    else {
      local_90 = xpath_node::attribute(local_18);
      p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_90);
      if (p_Var1 == (unspecified_bool_type)0x0) {
        local_b0 = xpath_node::attribute(local_20);
        p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_b0);
        if (p_Var1 != (unspecified_bool_type)0x0) {
          in_stack_ffffffffffffff48 = xpath_node::parent(in_stack_ffffffffffffff28);
          in_stack_ffffffffffffff40 = xpath_node::node(in_stack_ffffffffffffff28);
          bVar2 = xml_node::operator==
                            ((xml_node *)&stack0xffffffffffffff48,
                             (xml_node *)&stack0xffffffffffffff40);
          if (bVar2) {
            return true;
          }
          local_40 = xpath_node::parent(in_stack_ffffffffffffff28);
        }
      }
      else {
        local_98 = xpath_node::parent(in_stack_ffffffffffffff28);
        local_a0 = xpath_node::node(in_stack_ffffffffffffff28);
        bVar2 = xml_node::operator==(&local_98,&local_a0);
        if (bVar2) {
          return false;
        }
        local_a8 = (xml_node_struct *)xpath_node::parent(in_stack_ffffffffffffff28);
        local_38 = (xml_node)local_a8;
      }
    }
    bVar2 = xml_node::operator==(&local_38,&local_40);
    if (bVar2) {
      local_1 = false;
    }
    else {
      bVar2 = xml_node::operator!(&local_38);
      if ((bVar2) || (bVar2 = xml_node::operator!(&local_40), bVar2)) {
        local_1 = xml_node::operator<(&local_38,&local_40);
      }
      else {
        xml_node::internal_object(&local_38);
        xml_node::internal_object(&local_40);
        local_1 = node_is_before(in_stack_ffffffffffffff48._root,in_stack_ffffffffffffff40._root);
      }
    }
  }
  else {
    local_1 = local_28 < local_30;
  }
  return local_1;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}